

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::outputPostRegTupleString_abi_cxx11_
          (CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,bitset<7UL> *increasing,
          size_t stringOffset)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  long in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t k_3;
  size_t k_2;
  size_t i;
  string k_1;
  string k;
  string *outString;
  undefined1 in_stack_fffffffffffffbd8;
  byte in_stack_fffffffffffffbd9;
  undefined1 in_stack_fffffffffffffbda;
  undefined1 in_stack_fffffffffffffbdb;
  undefined1 in_stack_fffffffffffffbdc;
  undefined1 in_stack_fffffffffffffbdd;
  undefined1 in_stack_fffffffffffffbde;
  undefined1 in_stack_fffffffffffffbdf;
  string *__rhs;
  string local_400 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  CppGenerator *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  string local_3c0 [32];
  long local_3a0;
  reference local_398;
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  long local_328;
  reference local_320;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  ulong local_270;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  reference local_208;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  reference local_198;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [54];
  allocator local_32;
  undefined1 local_31;
  long local_20;
  long local_18;
  
  local_31 = 0;
  __rhs = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  if (local_20 + 1U < 3) {
    for (local_270 = 0; local_270 < local_20 + 1U; local_270 = local_270 + 1) {
      offset_abi_cxx11_(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
      std::operator+(in_RSI,(char *)__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::operator+(in_RSI,(char *)__rhs);
      std::__cxx11::string::operator+=((string *)in_RDI,local_290);
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::bitset<7UL>::operator[]((bitset<7UL> *)in_RSI,(size_t)__rhs);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)__rhs);
      std::bitset<7UL>::reference::~reference(&local_320);
      if ((bVar1 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
      }
      else {
        local_328 = *(long *)(local_18 + 8);
        in_stack_fffffffffffffbda =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)__rhs,
                        CONCAT17(in_stack_fffffffffffffbdf,
                                 CONCAT16(in_stack_fffffffffffffbde,
                                          CONCAT15(in_stack_fffffffffffffbdd,
                                                   CONCAT14(in_stack_fffffffffffffbdc,
                                                            CONCAT13(bVar1,CONCAT12(
                                                  in_stack_fffffffffffffbda,
                                                  CONCAT11(in_stack_fffffffffffffbd9,
                                                           in_stack_fffffffffffffbd8))))))));
        if ((bool)in_stack_fffffffffffffbda) {
          local_328 = local_270 + local_328;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
        std::operator+((char *)in_RSI,__rhs);
        std::operator+(in_RSI,(char *)__rhs);
        std::__cxx11::string::operator+=((string *)in_RDI,local_348);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_388);
      }
      std::bitset<7UL>::operator[]((bitset<7UL> *)in_RSI,(size_t)__rhs);
      in_stack_fffffffffffffbd9 = std::bitset::reference::operator_cast_to_bool((reference *)__rhs);
      std::bitset<7UL>::reference::~reference(&local_398);
      if ((in_stack_fffffffffffffbd9 & 1) != 0) {
        local_3a0 = *(long *)(local_18 + 0x10);
        in_stack_fffffffffffffbd8 =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)__rhs,
                        CONCAT17(in_stack_fffffffffffffbdf,
                                 CONCAT16(in_stack_fffffffffffffbde,
                                          CONCAT15(in_stack_fffffffffffffbdd,
                                                   CONCAT14(in_stack_fffffffffffffbdc,
                                                            CONCAT13(bVar1,CONCAT12(
                                                  in_stack_fffffffffffffbda,
                                                  CONCAT11(in_stack_fffffffffffffbd9,
                                                           in_stack_fffffffffffffbd8))))))));
        if ((bool)in_stack_fffffffffffffbd8) {
          local_3a0 = local_270 + local_3a0;
        }
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
        std::operator+((char *)in_RSI,__rhs);
        std::operator+(in_RSI,(char *)__rhs);
        std::__cxx11::string::operator+=((string *)in_RDI,local_3c0);
        std::__cxx11::string::~string(local_3c0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc20);
        std::__cxx11::string::~string(local_400);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    }
  }
  else {
    offset_abi_cxx11_(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
    std::operator+(in_RSI,(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    std::operator+(in_RSI,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    offset_abi_cxx11_(in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
    std::operator+(in_RSI,(char *)__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    std::operator+(in_RSI,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::bitset<7UL>::operator[]((bitset<7UL> *)in_RSI,(size_t)__rhs);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)__rhs);
    std::bitset<7UL>::reference::~reference(&local_198);
    if ((bVar1 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
      in_stack_fffffffffffffbde =
           std::bitset<7UL>::operator[]
                     ((bitset<7UL> *)__rhs,
                      CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffbde,
                                              CONCAT15(in_stack_fffffffffffffbdd,
                                                       CONCAT14(in_stack_fffffffffffffbdc,
                                                                CONCAT13(in_stack_fffffffffffffbdb,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffbda,
                                                  CONCAT11(in_stack_fffffffffffffbd9,
                                                           in_stack_fffffffffffffbd8))))))));
      if ((bool)in_stack_fffffffffffffbde) {
        std::__cxx11::string::operator+=(local_1b8,"+i");
      }
      std::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      std::operator+(in_RSI,(char *)__rhs);
      std::__cxx11::string::operator+=((string *)in_RDI,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_1b8);
    }
    std::bitset<7UL>::operator[]((bitset<7UL> *)in_RSI,(size_t)__rhs);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)__rhs);
    std::bitset<7UL>::reference::~reference(&local_208);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
      bVar3 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)__rhs,
                         CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffbde,
                                                 CONCAT15(bVar2,CONCAT14(in_stack_fffffffffffffbdc,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffbdb,
                                                  CONCAT12(in_stack_fffffffffffffbda,
                                                           CONCAT11(in_stack_fffffffffffffbd9,
                                                                    in_stack_fffffffffffffbd8)))))))
                        );
      if (bVar3) {
        std::__cxx11::string::operator+=(local_228,"+i");
      }
      std::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      std::operator+(in_RSI,(char *)__rhs);
      std::__cxx11::string::operator+=((string *)in_RDI,local_248);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_228);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::operator+=((string *)in_RDI,";\n");
  }
  return __rhs;
}

Assistant:

std::string CppGenerator::outputPostRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";
        outString += offset(stringOffset+1)+
            "postRegister["+std::to_string(idx.indexes[2])+"+i] += ";
        
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }
        // else
        // {
        //     ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
        //     //  exit(1);
        // }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="postRegister["+k+"]*";
        }
        
        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            outString += offset(stringOffset)+
                "postRegister["+std::to_string(idx.indexes[2]+i)+"] += ";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            else
            {
                ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
                // exit(1);
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="postRegister["+std::to_string(k)+"]*";
            }
            
            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}